

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O0

bool __thiscall
vkt::api::anon_unknown_0::BlittingImages::checkLinearFilteredResult
          (BlittingImages *this,ConstPixelBufferAccess *result,
          ConstPixelBufferAccess *clampedExpected,ConstPixelBufferAccess *unclampedExpected,
          TextureFormat *srcFormat)

{
  TextureFormat TVar1;
  bool bVar2;
  uint uVar3;
  TestContext *this_00;
  TextureFormat *pTVar4;
  int *piVar5;
  uint *puVar6;
  float local_2a4;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  LogSection local_238;
  uint local_1f8;
  undefined1 local_1f4 [4];
  deUint32 i;
  IVec4 bitDepth;
  UVec4 threshold_1;
  allocator<char> local_1a9;
  string local_1a8;
  LogSection local_188;
  undefined1 local_148 [8];
  Vec4 threshold;
  Vec4 dstMaxDiff;
  Vector<float,_4> local_118;
  undefined1 local_108 [8];
  Vec4 srcMaxDiff;
  bool srcIsSRGB;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_a9;
  string local_a8;
  LogSection local_88;
  byte local_41;
  TextureFormat TStack_40;
  bool isOk;
  TextureFormat dstFormat;
  TestLog *log;
  TextureFormat *srcFormat_local;
  ConstPixelBufferAccess *unclampedExpected_local;
  ConstPixelBufferAccess *clampedExpected_local;
  ConstPixelBufferAccess *result_local;
  BlittingImages *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_CopiesAndBlittingTestInstance).super_TestInstance.m_context);
  dstFormat = (TextureFormat)tcu::TestContext::getLog(this_00);
  pTVar4 = tcu::ConstPixelBufferAccess::getFormat(result);
  TVar1 = dstFormat;
  TStack_40 = *pTVar4;
  local_41 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"ClampedSourceImage",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Region with clamped edges on source image.",&local_e1);
  tcu::LogSection::LogSection(&local_88,&local_a8,&local_e0);
  tcu::TestLog::operator<<((TestLog *)TVar1,&local_88);
  tcu::LogSection::~LogSection(&local_88);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  bVar2 = isFloatFormat(TStack_40);
  if (bVar2) {
    srcMaxDiff.m_data._8_8_ = *srcFormat;
    bVar2 = tcu::isSRGB((TextureFormat)srcMaxDiff.m_data._8_8_);
    getFormatThreshold((anon_unknown_0 *)&local_118,srcFormat);
    local_2a4 = 2.0;
    if (!bVar2) {
      local_2a4 = 1.0;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dstMaxDiff.m_data + 2),local_2a4);
    tcu::operator*((tcu *)local_108,&local_118,(Vector<float,_4> *)(dstMaxDiff.m_data + 2));
    getFormatThreshold((anon_unknown_0 *)(threshold.m_data + 2),&stack0xffffffffffffffc0);
    tcu::max<float,4>((tcu *)local_148,(Vector<float,_4> *)local_108,
                      (Vector<float,_4> *)(threshold.m_data + 2));
    local_41 = tcu::floatThresholdCompare
                         ((TestLog *)dstFormat,"Compare","Result comparsion",clampedExpected,result,
                          (Vec4 *)local_148,COMPARE_LOG_RESULT);
    tcu::TestLog::operator<<((TestLog *)dstFormat,(EndSectionToken *)&tcu::TestLog::EndSection);
    TVar1 = dstFormat;
    if ((local_41 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"NonClampedSourceImage",&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(threshold_1.m_data + 3),"Region with non-clamped edges on source image."
                 ,(allocator<char> *)((long)threshold_1.m_data + 0xb));
      tcu::LogSection::LogSection(&local_188,&local_1a8,(string *)(threshold_1.m_data + 3));
      tcu::TestLog::operator<<((TestLog *)TVar1,&local_188);
      tcu::LogSection::~LogSection(&local_188);
      std::__cxx11::string::~string((string *)(threshold_1.m_data + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)threshold_1.m_data + 0xb));
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      local_41 = tcu::floatThresholdCompare
                           ((TestLog *)dstFormat,"Compare","Result comparsion",unclampedExpected,
                            result,(Vec4 *)local_148,COMPARE_LOG_RESULT);
      tcu::TestLog::operator<<((TestLog *)dstFormat,(EndSectionToken *)&tcu::TestLog::EndSection);
    }
  }
  else {
    tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(bitDepth.m_data + 2));
    tcu::getTextureFormatBitDepth((tcu *)local_1f4,&stack0xffffffffffffffc0);
    for (local_1f8 = 0; local_1f8 < 4; local_1f8 = local_1f8 + 1) {
      piVar5 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_1f4,local_1f8);
      uVar3 = de::max<int>((1 << ((byte)*piVar5 & 0x1f)) / 0x100,1);
      puVar6 = tcu::Vector<unsigned_int,_4>::operator[]
                         ((Vector<unsigned_int,_4> *)(bitDepth.m_data + 2),local_1f8);
      *puVar6 = uVar3;
    }
    local_41 = tcu::intThresholdCompare
                         ((TestLog *)dstFormat,"Compare","Result comparsion",clampedExpected,result,
                          (UVec4 *)(bitDepth.m_data + 2),COMPARE_LOG_RESULT);
    tcu::TestLog::operator<<((TestLog *)dstFormat,(EndSectionToken *)&tcu::TestLog::EndSection);
    TVar1 = dstFormat;
    if ((local_41 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_258,"NonClampedSourceImage",&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"Region with non-clamped edges on source image.",&local_281);
      tcu::LogSection::LogSection(&local_238,&local_258,&local_280);
      tcu::TestLog::operator<<((TestLog *)TVar1,&local_238);
      tcu::LogSection::~LogSection(&local_238);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      local_41 = tcu::intThresholdCompare
                           ((TestLog *)dstFormat,"Compare","Result comparsion",unclampedExpected,
                            result,(UVec4 *)(bitDepth.m_data + 2),COMPARE_LOG_RESULT);
      tcu::TestLog::operator<<((TestLog *)dstFormat,(EndSectionToken *)&tcu::TestLog::EndSection);
    }
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool BlittingImages::checkLinearFilteredResult (const tcu::ConstPixelBufferAccess&	result,
												const tcu::ConstPixelBufferAccess&	clampedExpected,
												const tcu::ConstPixelBufferAccess&	unclampedExpected,
												const tcu::TextureFormat&			srcFormat)
{
	tcu::TestLog&				log			(m_context.getTestContext().getLog());
	const tcu::TextureFormat	dstFormat	= result.getFormat();
	bool						isOk		= false;

	log << tcu::TestLog::Section("ClampedSourceImage", "Region with clamped edges on source image.");

	if (isFloatFormat(dstFormat))
	{
		const bool		srcIsSRGB	= tcu::isSRGB(srcFormat);
		const tcu::Vec4	srcMaxDiff	= getFormatThreshold(srcFormat) * tcu::Vec4(srcIsSRGB ? 2.0f : 1.0f);
		const tcu::Vec4	dstMaxDiff	= getFormatThreshold(dstFormat);
		const tcu::Vec4	threshold	= tcu::max(srcMaxDiff, dstMaxDiff);

		isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::floatThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}
	else
	{
		tcu::UVec4	threshold;
		// Calculate threshold depending on channel width of destination format.
		const tcu::IVec4	bitDepth	= tcu::getTextureFormatBitDepth(dstFormat);
		for (deUint32 i = 0; i < 4; ++i)
			threshold[i] = de::max( (0x1 << bitDepth[i]) / 256, 1);

		isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", clampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
		log << tcu::TestLog::EndSection;

		if (!isOk)
		{
			log << tcu::TestLog::Section("NonClampedSourceImage", "Region with non-clamped edges on source image.");
			isOk = tcu::intThresholdCompare(log, "Compare", "Result comparsion", unclampedExpected, result, threshold, tcu::COMPARE_LOG_RESULT);
			log << tcu::TestLog::EndSection;
		}
	}

	return isOk;
}